

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gotcha_dl.c
# Opt level: O0

void * dlopen_wrapper(char *filename,int flags)

{
  uint uVar1;
  uint uVar2;
  code *pcVar3;
  void *pvVar4;
  char *pcVar5;
  undefined4 in_ESI;
  undefined8 in_RDI;
  void *handle;
  _func_void_ptr_char_ptr_int *orig_dlopen;
  _func_int_hash_key_t_hash_data_t_void_ptr *in_stack_ffffffffffffff78;
  void *in_stack_ffffffffffffff80;
  hash_table_t *in_stack_ffffffffffffff88;
  FILE *pFVar6;
  uint in_stack_ffffffffffffff90;
  uint in_stack_ffffffffffffff94;
  char *local_60;
  char *local_40;
  
  pcVar3 = (code *)gotcha_get_wrappee(orig_dlopen_handle);
  pFVar6 = _stderr;
  if (0 < debug_level) {
    uVar1 = gotcha_gettid();
    uVar2 = getpid();
    local_40 = strrchr("/workspace/llm4binary/github/license_all_cmakelists_1510/hbrunie[P]PyFloT/external-deps/GOTCHA/src/gotcha_dl.c"
                       ,0x2f);
    if (local_40 == (char *)0x0) {
      local_40 = "";
    }
    fprintf(pFVar6,"[%d/%d][%s:%u] - User called dlopen(%s, 0x%x)\n",(ulong)uVar1,(ulong)uVar2,
            local_40 + 1,0x28,in_RDI,in_ESI);
  }
  pvVar4 = (void *)(*pcVar3)(in_RDI,in_ESI);
  pFVar6 = _stderr;
  if (1 < debug_level) {
    uVar1 = gotcha_gettid();
    uVar2 = getpid();
    local_60 = strrchr("/workspace/llm4binary/github/license_all_cmakelists_1510/hbrunie[P]PyFloT/external-deps/GOTCHA/src/gotcha_dl.c"
                       ,0x2f);
    if (local_60 == (char *)0x0) {
      local_60 = "";
    }
    fprintf(pFVar6,
            "[%d/%d][%s:%u] - Searching new dlopened libraries for previously-not-found exports\n",
            (ulong)uVar1,(ulong)uVar2,local_60 + 1,0x2b);
  }
  foreach_hash_entry(in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  if (1 < debug_level) {
    pFVar6 = _stderr;
    in_stack_ffffffffffffff90 = gotcha_gettid();
    in_stack_ffffffffffffff94 = getpid();
    pcVar5 = strrchr("/workspace/llm4binary/github/license_all_cmakelists_1510/hbrunie[P]PyFloT/external-deps/GOTCHA/src/gotcha_dl.c"
                     ,0x2f);
    if (pcVar5 == (char *)0x0) {
      pcVar5 = "";
    }
    fprintf(pFVar6,"[%d/%d][%s:%u] - Updating GOT entries for new dlopened libraries\n",
            (ulong)in_stack_ffffffffffffff90,(ulong)in_stack_ffffffffffffff94,pcVar5 + 1,0x2e);
  }
  update_all_library_gots
            ((hash_table_t *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
  return pvVar4;
}

Assistant:

static void* dlopen_wrapper(const char* filename, int flags) {
   typeof(&dlopen_wrapper) orig_dlopen = gotcha_get_wrappee(orig_dlopen_handle);
   void *handle;
   debug_printf(1, "User called dlopen(%s, 0x%x)\n", filename, (unsigned int) flags);
   handle = orig_dlopen(filename,flags);

   debug_printf(2, "Searching new dlopened libraries for previously-not-found exports\n");
   foreach_hash_entry(&notfound_binding_table, NULL, per_binding);

   debug_printf(2, "Updating GOT entries for new dlopened libraries\n");
   update_all_library_gots(&function_hash_table);
  
   return handle;
}